

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

void __thiscall
Darts::Details::DoubleArrayBuilder::build_from_dawg
          (DoubleArrayBuilder *this,DawgBuilder *dawg,id_type dawg_id,id_type dic_id)

{
  uint *puVar1;
  byte bVar2;
  id_type iVar3;
  id_type iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong id;
  
  uVar5 = *(uint *)((dawg->units_).buf_.array_ + (ulong)dawg_id * 4);
  uVar7 = uVar5 >> 2;
  id = (ulong)uVar7;
  uVar6 = (ulong)(uVar5 >> 7);
  if ((*(uint *)((dawg->is_intersections_).units_.buf_.array_ + uVar6 * 4) >> (uVar7 & 0x1f) & 1) !=
      0) {
    iVar3 = BitVector::rank(&dawg->is_intersections_,id);
    uVar5 = (this->table_).array_[iVar3 - 1];
    if ((uVar5 != 0) && (uVar5 = uVar5 ^ dic_id, (uVar5 & 0x1fe00000) == 0 || (char)uVar5 == '\0'))
    {
      if ((dawg->labels_).buf_.array_[id] == '\0') {
        puVar1 = (uint *)((this->units_).buf_.array_ + (ulong)dic_id * 4);
        *puVar1 = *puVar1 | 0x100;
      }
      DoubleArrayBuilderUnit::set_offset
                ((DoubleArrayBuilderUnit *)((this->units_).buf_.array_ + (ulong)dic_id * 4),uVar5);
      return;
    }
  }
  iVar3 = arrange_from_dawg(this,dawg,dawg_id,dic_id);
  if ((*(uint *)((dawg->is_intersections_).units_.buf_.array_ + uVar6 * 4) &
      1 << ((byte)uVar7 & 0x1f)) != 0) {
    iVar4 = BitVector::rank(&dawg->is_intersections_,id);
    (this->table_).array_[iVar4 - 1] = iVar3;
  }
  do {
    bVar2 = (dawg->labels_).buf_.array_[id];
    if (bVar2 != 0) {
      build_from_dawg(this,dawg,(id_type)id,bVar2 ^ iVar3);
    }
    uVar5 = (id_type)id + 1 & -(*(uint *)((dawg->units_).buf_.array_ + id * 4) & 1);
    id = (ulong)uVar5;
  } while (uVar5 != 0);
  return;
}

Assistant:

inline void DoubleArrayBuilder::build_from_dawg(const DawgBuilder &dawg,
    id_type dawg_id, id_type dic_id) {
  id_type dawg_child_id = dawg.child(dawg_id);
  if (dawg.is_intersection(dawg_child_id)) {
    id_type intersection_id = dawg.intersection_id(dawg_child_id);
    id_type offset = table_[intersection_id];
    if (offset != 0) {
      offset ^= dic_id;
      if (!(offset & UPPER_MASK) || !(offset & LOWER_MASK)) {
        if (dawg.is_leaf(dawg_child_id)) {
          units_[dic_id].set_has_leaf(true);
        }
        units_[dic_id].set_offset(offset);
        return;
      }
    }
  }

  id_type offset = arrange_from_dawg(dawg, dawg_id, dic_id);
  if (dawg.is_intersection(dawg_child_id)) {
    table_[dawg.intersection_id(dawg_child_id)] = offset;
  }

  do {
    uchar_type child_label = dawg.label(dawg_child_id);
    id_type dic_child_id = offset ^ child_label;
    if (child_label != '\0') {
      build_from_dawg(dawg, dawg_child_id, dic_child_id);
    }
    dawg_child_id = dawg.sibling(dawg_child_id);
  } while (dawg_child_id != 0);
}